

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

lua_Number lua_tonumberx(lua_State *L,int idx,int *ok)

{
  int iVar1;
  TValue *pTVar2;
  TValue TVar3;
  TValue tmp;
  TValue local_10;
  
  pTVar2 = index2adr(L,idx);
  TVar3 = (TValue)pTVar2->n;
  if ((ulong)(TVar3.it64 >> 0x2f) < 0xfffffffffffffff3) {
    if (ok != (int *)0x0) {
      *ok = 1;
      TVar3.n = pTVar2->n;
    }
  }
  else if ((TVar3.it64 >> 0x2f == 0xfffffffffffffffb) &&
          (iVar1 = lj_strscan_num((GCstr *)(TVar3.u64 & 0x7fffffffffff),&local_10), iVar1 != 0)) {
    TVar3 = local_10;
    if (ok != (int *)0x0) {
      *ok = 1;
    }
  }
  else {
    TVar3.u64 = 0;
    if (ok != (int *)0x0) {
      *ok = 0;
    }
  }
  return TVar3.n;
}

Assistant:

LUA_API lua_Number lua_tonumberx(lua_State *L, int idx, int *ok)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o))) {
    if (ok) *ok = 1;
    return numberVnum(o);
  } else if (tvisstr(o) && lj_strscan_num(strV(o), &tmp)) {
    if (ok) *ok = 1;
    return numV(&tmp);
  } else {
    if (ok) *ok = 0;
    return 0;
  }
}